

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

BitDepthInfo get_bit_depth_info(MACROBLOCKD *xd)

{
  int iVar1;
  BitDepthInfo BVar2;
  int iVar3;
  MACROBLOCKD *in_RDI;
  BitDepthInfo bit_depth_info;
  
  iVar1 = in_RDI->bd;
  iVar3 = is_cur_buf_hbd(in_RDI);
  BVar2.use_highbitdepth_buf = iVar3;
  BVar2.bit_depth = iVar1;
  return BVar2;
}

Assistant:

static inline BitDepthInfo get_bit_depth_info(const MACROBLOCKD *xd) {
  BitDepthInfo bit_depth_info;
  bit_depth_info.bit_depth = xd->bd;
  bit_depth_info.use_highbitdepth_buf = is_cur_buf_hbd(xd);
  assert(IMPLIES(!bit_depth_info.use_highbitdepth_buf,
                 bit_depth_info.bit_depth == 8));
  return bit_depth_info;
}